

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::build_assert
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int is_negative,
          int is_lookback)

{
  int iVar1;
  re_tuple *prVar2;
  re_recog_type typ;
  int in_ECX;
  wchar_t *in_RDX;
  int *in_RSI;
  CRegexParser *in_RDI;
  int in_R8D;
  re_tuple *t;
  int *in_stack_00000048;
  int *in_stack_00000050;
  re_state_id in_stack_00000058;
  re_state_id in_stack_0000005c;
  CRegexParser *in_stack_00000060;
  re_machine *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  init_machine((CRegexParser *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  prVar2 = in_RDI->tuple_arr_;
  iVar1 = *in_RSI;
  if (in_R8D == 0) {
    typ = RE_ASSERT_POS;
    if (in_ECX != 0) {
      typ = RE_ASSERT_NEG;
    }
  }
  else {
    typ = RE_ASSERT_BACKPOS;
    if (in_ECX != 0) {
      typ = RE_ASSERT_BACKNEG;
    }
  }
  set_trans(in_RDI,*in_RSI,in_RSI[1],typ,L'\0');
  prVar2[iVar1].info.ch = *in_RDX;
  prVar2[iVar1].info.sub.final = in_RDX[1];
  if (in_R8D != 0) {
    get_match_length(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050,
                     in_stack_00000048,(regex_scan_frame *)this);
  }
  return;
}

Assistant:

void CRegexParser::build_assert(re_machine *new_machine,
                                re_machine *sub_machine,
                                int is_negative, int is_lookback)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* get a pointer to its initial state */
    re_tuple *t = &tuple_arr_[new_machine->init];

    /* allocate a transition tuple for the new state */
    set_trans(new_machine->init, new_machine->final,
              (is_lookback
               ? (is_negative ? RE_ASSERT_BACKNEG : RE_ASSERT_BACKPOS)
               : (is_negative ? RE_ASSERT_NEG : RE_ASSERT_POS)),
              0);

    /* set the sub-state */
    t->info.sub.init = sub_machine->init;
    t->info.sub.final = sub_machine->final;

    /* 
     *   For lookback assertions, we need to know the range of possible match
     *   lengths, to optimize the reverse search for a match.  The
     *   sub-machine for the assertion is fully built now and is by nature
     *   self-contained, so we can calculate its length range now.  
     */
    if (is_lookback)
        get_match_length(sub_machine->init, sub_machine->final,
                         &t->info.sub.minlen, &t->info.sub.maxlen, 0);
}